

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O1

void __thiscall gepard::SegmentApproximator::~SegmentApproximator(SegmentApproximator *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  
  for (p_Var4 = (this->_segments)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->_segments)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    p_Var1 = p_Var4[1]._M_parent;
    if (p_Var1 != (_Base_ptr)0x0) {
      p_Var3 = *(_Base_ptr *)p_Var1;
      while (p_Var3 != p_Var1) {
        p_Var2 = *(_Base_ptr *)p_Var3;
        operator_delete(p_Var3);
        p_Var3 = p_Var2;
      }
      operator_delete(p_Var1);
    }
  }
  std::
  _Rb_tree<const_int,_std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>,_std::_Select1st<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>,_std::less<const_int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>_>
  ::~_Rb_tree(&(this->_segments)._M_t);
  return;
}

Assistant:

SegmentApproximator::~SegmentApproximator()
{
    for (SegmentTree::iterator it = _segments.begin(); it != _segments.end(); ++it) {
        delete it->second;
    }
}